

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Browse(void)

{
  Task *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  string sStack_a98;
  Task selectStack;
  Task moveToDestination;
  Task wait;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_a98,"browse",(allocator<char> *)&selectStack);
  Task::Task(in_RDI,&sStack_a98,Compound);
  std::__cxx11::string::~string((string *)&sStack_a98);
  Task::Task(&selectStack);
  selectStack.action = SelectDestination;
  moveToDestination.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>
            (&selectStack.parameters.values,(float *)&moveToDestination);
  debugSphereColour.z = in_XMM2_Da;
  debugSphereColour.x = (float)(int)in_XMM1_Qa;
  debugSphereColour.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  create_MoveToDestination(&moveToDestination,(AI *)0x1,70.0,debugSphereColour,1.0,true,true,in_R8D)
  ;
  create_Wait(&wait,5.0);
  Task::addSubtask(in_RDI,&selectStack);
  Task::addSubtask(in_RDI,&moveToDestination);
  Task::addSubtask(in_RDI,&wait);
  Task::~Task(&wait);
  Task::~Task(&moveToDestination);
  Task::~Task(&selectStack);
  return in_RDI;
}

Assistant:

Task create_Browse()
	{
		Task browse  {"browse", TaskType::Compound};
		Task selectStack;
		selectStack.action = Action::SelectDestination;
		selectStack.parameters.values.push_back(static_cast<float>(DestinationType::RandomStack));

		auto moveToDestination = create_MoveToDestination(70.f, {0.8f, 0.4f, 0.4f});
		auto wait = create_Wait(5.f);

		browse.addSubtask(selectStack);
		browse.addSubtask(moveToDestination);
		browse.addSubtask(wait);

		return browse;
	}